

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O1

void spell_lifebane(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  CHAR_DATA *pCVar1;
  char *__format;
  bool bVar2;
  bool bVar3;
  int sn_00;
  int sn_01;
  int sn_02;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  int iVar7;
  CHAR_DATA *victim;
  char buf [4608];
  char local_1238 [4616];
  
  sn_00 = skill_lookup("poison");
  sn_01 = skill_lookup("curse");
  sn_02 = skill_lookup("weaken");
  if (((ch->in_room->room_flags[0] & 8) == 0) && (ch->in_room->sector_type != 7)) {
    bVar2 = false;
  }
  else {
    bVar2 = true;
  }
  iVar4 = dice(level,4);
  victim = ch->in_room->people;
  if (victim != (CHAR_DATA *)0x0) {
    do {
      pCVar1 = victim->next_in_room;
      bVar3 = is_safe(ch,victim);
      if (!bVar3) {
        if (!bVar2) {
          bVar3 = is_same_group(ch,victim);
          if (bVar3) goto LAB_002b9283;
        }
        bVar3 = is_npc(ch);
        if (!bVar3) {
          bVar3 = is_npc(victim);
          if ((!bVar3) &&
             ((ch->fighting == (CHAR_DATA *)0x0 || (victim->fighting == (CHAR_DATA *)0x0)))) {
            uVar5 = number_range(0,2);
            if (uVar5 < 3) {
              __format = (&PTR_anon_var_dwarf_c786e5_004953e8)[uVar5];
              pcVar6 = pers(ch,victim);
              sprintf(local_1238,__format,pcVar6);
            }
            if (victim != ch) {
              do_myell(victim,local_1238,ch);
            }
          }
        }
        bVar3 = saves_spell(level,victim,9);
        iVar7 = iVar4;
        if (bVar3) {
          iVar7 = iVar4 / 2;
        }
        damage_old(ch,victim,iVar7,sn,9,true);
        iVar7 = target;
        spell_poison(sn_00,level + -5,ch,victim,target);
        spell_weaken(sn_02,level + -5,ch,victim,iVar7);
        spell_curse(sn_01,level + -8,ch,victim,iVar7);
      }
LAB_002b9283:
      victim = pCVar1;
    } while (pCVar1 != (CHAR_DATA *)0x0);
  }
  return;
}

Assistant:

void spell_lifebane(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *vch;
	CHAR_DATA *vch_next;
	char buf[MAX_STRING_LENGTH];

	int sn_poison, sn_curse, sn_weaken;
	int dam, tmp_dam;
	bool inside = false;

	sn_poison = skill_lookup("poison");
	sn_curse = skill_lookup("curse");
	sn_weaken = skill_lookup("weaken");

	if (IS_SET(ch->in_room->room_flags, ROOM_INDOORS) || ch->in_room->sector_type == SECT_INSIDE)
		inside = true;

	dam = dice(level, 4);

	for (vch = ch->in_room->people; vch != nullptr; vch = vch_next)
	{
		vch_next = vch->next_in_room;

		if (is_safe(ch, vch))
			continue;

		if (!(inside) && is_same_group(ch, vch))
			continue;

		tmp_dam = dam;

		if (vch == ch)
			tmp_dam /= 2;

		if (!is_npc(ch) && !is_npc(vch) && (ch->fighting == nullptr || vch->fighting == nullptr))
		{
			switch (number_range(0, 2))
			{
				case 0:
				case 1:
					sprintf(buf, "Die, %s you sorcerous dog!", pers(ch, vch));
					break;
				case 2:
					sprintf(buf, "Help! %s is casting a spell on me!", pers(ch, vch));
			}

			if (vch != ch)
				do_myell(vch, buf, ch);
		}

		if (saves_spell(level, vch, DAM_NEGATIVE))
			damage_old(ch, vch, dam / 2, sn, DAM_NEGATIVE, true);
		else
			damage_old(ch, vch, dam, sn, DAM_NEGATIVE, true);

		spell_poison(sn_poison, level - 5, ch, vch, target);
		spell_weaken(sn_weaken, level - 5, ch, vch, target);
		spell_curse(sn_curse, level - 8, ch, vch, target);
	}
}